

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall
SQLite::Database::createFunction
          (Database *this,char *apFuncName,int aNbArg,bool abDeterministic,void *apApp,
          _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *apFunc,
          _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *apStep,
          _func_void_sqlite3_context_ptr *apFinal,_func_void_void_ptr *apDestroy)

{
  int ret;
  Exception *this_00;
  undefined7 in_register_00000009;
  
  ret = sqlite3_create_function_v2
                  (this->mpSQLite,apFuncName,aNbArg,
                   (int)CONCAT71(in_register_00000009,abDeterministic) * 0x800 + 1,apApp,apFunc,
                   apStep,apFinal,apDestroy);
  if (ret == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,this->mpSQLite,ret);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Database::createFunction(const char*   apFuncName,
                              int           aNbArg,
                              bool          abDeterministic,
                              void*         apApp,
                              void        (*apFunc)(sqlite3_context *, int, sqlite3_value **),
                              void        (*apStep)(sqlite3_context *, int, sqlite3_value **),
                              void        (*apFinal)(sqlite3_context *),   // NOLINT(readability/casting)
                              void        (*apDestroy)(void *))
{
    int TextRep = SQLITE_UTF8;
    // optimization if deterministic function (e.g. of nondeterministic function random())
    if (abDeterministic) {
        TextRep = TextRep|SQLITE_DETERMINISTIC;
    }
    const int ret = sqlite3_create_function_v2(mpSQLite, apFuncName, aNbArg, TextRep,
                                               apApp, apFunc, apStep, apFinal, apDestroy);
    check(ret);
}